

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

void __thiscall Js::SourceTextModuleRecord::GenerateRootFunction(SourceTextModuleRecord *this)

{
  Type *this_00;
  ScriptContext *this_01;
  BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  SourceTextModuleRecord *pSVar6;
  JavascriptFunction *ptr;
  DebugContext *this_02;
  FunctionBody *func;
  char16 *sourceUrl;
  JavascriptError *ptr_00;
  ulong uVar7;
  undefined1 auStack_88 [8];
  CompileScriptException se;
  AutoDynamicCodeReference dynamicFunctionReference;
  
  if ((this->rootFunction).ptr == (JavascriptFunction *)0x0) {
    this_01 = (this->scriptContext).ptr;
    se.bstrLine = (BSTR)this_01;
    JavascriptLibrary::BeginDynamicFunctionReferences
              ((this_01->super_ScriptContextBase).javascriptLibrary);
    se.hasLineNumberInfo = false;
    se._81_7_ = 0;
    auStack_88._0_4_ = 0;
    auStack_88._4_4_ = 0;
    se.super_ScriptException.ichMin = 0;
    se.super_ScriptException.ichLim = 0;
    se.super_ScriptException.ei.wCode = 0;
    se.super_ScriptException.ei.wReserved = 0;
    se.super_ScriptException.ei._4_4_ = 0;
    se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
    se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
    se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
    se.super_ScriptException.ei.dwHelpContext = 0;
    se.super_ScriptException.ei._36_4_ = 0;
    se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
    se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
    se.super_ScriptException.ei.scode = 0;
    se.super_ScriptException.ei._60_4_ = 0;
    se.line._0_1_ = 0;
    if (this->wasDeclarationInitialized == false) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                  ,0x3b0,"(this->WasDeclarationInitialized())",
                                  "this->WasDeclarationInitialized()");
      if (!bVar3) goto LAB_009e9df5;
      *puVar5 = 0;
    }
    pSVar6 = JavascriptLibrary::GetModuleRecord
                       ((this_01->super_ScriptContextBase).javascriptLibrary,
                        ((((this->pSourceInfo).ptr)->m_srcInfo).ptr)->moduleID);
    if (pSVar6 != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                  ,0x3b1,
                                  "(this == scriptContext->GetLibrary()->GetModuleRecord(this->pSourceInfo->GetSrcInfo()->moduleID))"
                                  ,
                                  "this == scriptContext->GetLibrary()->GetModuleRecord(this->pSourceInfo->GetSrcInfo()->moduleID)"
                                 );
      if (!bVar3) {
LAB_009e9df5:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    ptr = ScriptContext::GenerateRootFunction
                    (this_01,(this->parseTree).ptr,this->sourceIndex,this->parser,
                     ((this->pSourceInfo).ptr)->parseFlags,(CompileScriptException *)auStack_88,
                     L"Module code");
    this_00 = &this->rootFunction;
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet(this_00,ptr);
    ReleaseParserResources(this);
    if (this_00->ptr == (JavascriptFunction *)0x0) {
      sourceUrl = GetSpecifierSz(this);
      ptr_00 = JavascriptError::CreateFromCompileScriptException
                         (this_01,(CompileScriptException *)auStack_88,sourceUrl);
      Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->errorObject,ptr_00);
      Output::TraceWithFlush(ModulePhase,L"\t>NotifyParentAsNeeded rootFunction == nullptr\n");
      NotifyParentsAsNeeded(this);
    }
    else {
      this_02 = ScriptContext::GetDebugContext(this_01);
      func = JavascriptFunction::GetFunctionBody(this_00->ptr);
      DebugContext::RegisterFunction(this_02,&func->super_ParseableFunctionInfo,(LPCWSTR)0x0);
    }
    pBVar1 = (this->childrenModuleSet).ptr;
    if (pBVar1 != (BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *)0x0) {
      for (uVar7 = 0; uVar7 < pBVar1->bucketCount; uVar7 = uVar7 + 1) {
        iVar4 = pBVar1->buckets[uVar7];
        if (iVar4 != -1) {
          for (; iVar4 != -1;
              iVar4 = pBVar1->entries[iVar4].
                      super_DefaultHashedEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                      .super_KeyValueEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*>.
                      super_ValueEntry<Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>_>
                      .
                      super_KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>
                      .next) {
            (**(code **)(*(long *)&((pBVar1->entries[iVar4].
                                     super_DefaultHashedEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                     .
                                     super_KeyValueEntry<const_char16_t_*,_Js::SourceTextModuleRecord_*>
                                     .
                                     super_ValueEntry<Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>_>
                                     .
                                     super_KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>
                                    .value)->super_ModuleRecordBase).super_FinalizableObject + 0x58)
            )();
          }
        }
      }
    }
    CompileScriptException::~CompileScriptException((CompileScriptException *)auStack_88);
    AutoDynamicCodeReference::~AutoDynamicCodeReference((AutoDynamicCodeReference *)&se.bstrLine);
  }
  return;
}

Assistant:

void SourceTextModuleRecord::GenerateRootFunction()
    {
        // On cyclic dependency, we may end up generating the root function twice
        // so make sure we don't
        if (this->rootFunction != nullptr)
        {
            return;
        }

        ScriptContext* scriptContext = GetScriptContext();
        Js::AutoDynamicCodeReference dynamicFunctionReference(scriptContext);
        CompileScriptException se;

        Assert(this->WasDeclarationInitialized());
        Assert(this == scriptContext->GetLibrary()->GetModuleRecord(this->pSourceInfo->GetSrcInfo()->moduleID));

        this->rootFunction = scriptContext->GenerateRootFunction(parseTree, sourceIndex, this->parser, this->pSourceInfo->GetParseFlags(), &se, Constants::ModuleCode);

        // Parser uses a temporary guest arena to keep regex patterns alive. We need to release this arena only after we have no further use
        // for the regex pattern objects.
        this->ReleaseParserResources();

        if (rootFunction == nullptr)
        {
            const WCHAR * sourceUrl = this->GetSpecifierSz();

            this->errorObject = JavascriptError::CreateFromCompileScriptException(scriptContext, &se, sourceUrl);
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyParentAsNeeded rootFunction == nullptr\n"));
            NotifyParentsAsNeeded();
        }
#ifdef ENABLE_SCRIPT_DEBUGGING
        else
        {
            scriptContext->GetDebugContext()->RegisterFunction(this->rootFunction->GetFunctionBody(), nullptr);
        }
#endif
        if (childrenModuleSet != nullptr)
        {
            childrenModuleSet->EachValue([=](SourceTextModuleRecord* childModuleRecord)
            {
                childModuleRecord->GenerateRootFunction();
            });
        }
    }